

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O1

void __thiscall
ScenePreprocessorTest_testMeshPreprocessingNeg_Test::TestBody
          (ScenePreprocessorTest_testMeshPreprocessingNeg_Test *this)

{
  bool bVar1;
  aiMesh *mesh;
  char *message;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  mesh = (aiMesh *)operator_new(0x520);
  mesh->mPrimitiveTypes = 0;
  mesh->mNumVertices = 0;
  mesh->mNumFaces = 0;
  memset(&mesh->mVertices,0,0xcc);
  mesh->mBones = (aiBone **)0x0;
  mesh->mMaterialIndex = 0;
  (mesh->mName).length = 0;
  (mesh->mName).data[0] = '\0';
  memset((mesh->mName).data + 1,0x1b,0x3ff);
  mesh->mNumAnimMeshes = 0;
  mesh->mAnimMeshes = (aiAnimMesh **)0x0;
  mesh->mMethod = 0;
  (mesh->mAABB).mMin.x = 0.0;
  (mesh->mAABB).mMin.y = 0.0;
  (mesh->mAABB).mMin.z = 0.0;
  (mesh->mAABB).mMax.x = 0.0;
  (mesh->mAABB).mMax.y = 0.0;
  (mesh->mAABB).mMax.z = 0.0;
  mesh->mTextureCoords[0] = (aiVector3D *)0x0;
  mesh->mTextureCoords[1] = (aiVector3D *)0x0;
  mesh->mTextureCoords[2] = (aiVector3D *)0x0;
  mesh->mTextureCoords[3] = (aiVector3D *)0x0;
  mesh->mTextureCoords[4] = (aiVector3D *)0x0;
  mesh->mTextureCoords[5] = (aiVector3D *)0x0;
  mesh->mTextureCoords[6] = (aiVector3D *)0x0;
  mesh->mTextureCoords[7] = (aiVector3D *)0x0;
  mesh->mNumUVComponents[0] = 0;
  mesh->mNumUVComponents[1] = 0;
  mesh->mNumUVComponents[2] = 0;
  mesh->mNumUVComponents[3] = 0;
  mesh->mNumUVComponents[4] = 0;
  mesh->mNumUVComponents[5] = 0;
  mesh->mNumUVComponents[6] = 0;
  mesh->mNumUVComponents[7] = 0;
  mesh->mColors[0] = (aiColor4D *)0x0;
  mesh->mColors[1] = (aiColor4D *)0x0;
  mesh->mColors[2] = (aiColor4D *)0x0;
  mesh->mColors[3] = (aiColor4D *)0x0;
  mesh->mColors[4] = (aiColor4D *)0x0;
  mesh->mColors[5] = (aiColor4D *)0x0;
  mesh->mColors[6] = (aiColor4D *)0x0;
  mesh->mColors[7] = (aiColor4D *)0x0;
  mesh->mPrimitiveTypes = 0xc;
  Assimp::ScenePreprocessor::ProcessMesh
            ((this->super_ScenePreprocessorTest).mScenePreprocessor,mesh);
  local_40.ptr_._0_4_ = 0xc;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_30,"static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON)",
             "p->mPrimitiveTypes",(uint *)&local_40,(uint *)mesh);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x9b,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
      local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  aiMesh::~aiMesh(mesh);
  operator_delete(mesh,0x520);
  return;
}

Assistant:

TEST_F(ScenePreprocessorTest, testMeshPreprocessingNeg) {
    aiMesh* p = new aiMesh;
    p->mPrimitiveTypes = aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON;
    ProcessMesh(p);

    // should be unmodified
    EXPECT_EQ(static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON),
              p->mPrimitiveTypes);

    delete p;
}